

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O2

void __thiscall
QGraphicsItemAnimation::setTimeLine(QGraphicsItemAnimation *this,QTimeLine *timeLine)

{
  long lVar1;
  long *plVar2;
  bool bVar3;
  QTimeLine *pQVar4;
  long in_FS_OFFSET;
  Connection CStack_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x10);
  if ((*(long *)(lVar1 + 8) == 0) || (*(int *)(*(long *)(lVar1 + 8) + 4) == 0)) {
    pQVar4 = (QTimeLine *)0x0;
  }
  else {
    pQVar4 = *(QTimeLine **)(lVar1 + 0x10);
  }
  if (pQVar4 != timeLine) {
    bVar3 = QPointer::operator_cast_to_bool((QPointer *)(lVar1 + 8));
    if (bVar3) {
      lVar1 = *(long *)(*(long *)(this + 0x10) + 8);
      if (((lVar1 != 0) && (*(int *)(lVar1 + 4) != 0)) &&
         (plVar2 = *(long **)(*(long *)(this + 0x10) + 0x10), plVar2 != (long *)0x0)) {
        (**(code **)(*plVar2 + 0x20))();
      }
    }
    if (timeLine != (QTimeLine *)0x0) {
      QWeakPointer<QObject>::assign<QObject>
                ((QWeakPointer<QObject> *)(*(long *)(this + 0x10) + 8),(QObject *)timeLine);
      QObject::connect((QObject *)&CStack_28,(char *)timeLine,(QObject *)"2valueChanged(qreal)",
                       (char *)this,0x67c21e);
      QMetaObject::Connection::~Connection(&CStack_28);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemAnimation::setTimeLine(QTimeLine *timeLine)
{
    if (d->timeLine == timeLine)
        return;
    if (d->timeLine)
        delete d->timeLine;
    if (!timeLine)
        return;
    d->timeLine = timeLine;
    connect(timeLine, SIGNAL(valueChanged(qreal)), this, SLOT(setStep(qreal)));
}